

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O3

bool __thiscall
directed_flag_complex_in_memory_computer::
coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::has_next(coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  ulong uVar1;
  ulong uVar2;
  _Elt_pointer peVar3;
  const_iterator local_58;
  const_iterator local_38;
  
  if ((long)this->index == 0xffffffffffffffff) {
    return false;
  }
  compressed_sparse_matrix<entry_t>::cbegin(&local_38,this->matrix,(long)this->index);
  uVar2 = ((long)local_38._M_cur - (long)local_38._M_first >> 3) + this->current_offset;
  if ((long)uVar2 < 0) {
    uVar1 = (long)uVar2 >> 6;
  }
  else {
    if (uVar2 < 0x40) {
      peVar3 = local_38._M_cur + this->current_offset;
      goto LAB_00136fcf;
    }
    uVar1 = uVar2 >> 6;
  }
  peVar3 = local_38._M_node[uVar1] + uVar2 + uVar1 * -0x40;
LAB_00136fcf:
  compressed_sparse_matrix<entry_t>::cend(&local_58,this->matrix,(long)this->index);
  return peVar3 != local_58._M_cur;
}

Assistant:

bool has_next() { return index != -1 && matrix.cbegin(index) + current_offset != matrix.cend(index); }